

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::AddUtility(cmTarget *this,string *u,cmMakefile *makefile)

{
  cmMakefile *__x;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar1;
  bool local_101;
  cmListFileBacktrace local_e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
  local_a0;
  _Base_ptr local_40;
  undefined1 local_38;
  _Base_ptr local_30;
  undefined1 local_28;
  cmMakefile *local_20;
  cmMakefile *makefile_local;
  string *u_local;
  cmTarget *this_local;
  
  local_20 = makefile;
  makefile_local = (cmMakefile *)u;
  u_local = (string *)this;
  pVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->Utilities,u);
  __x = makefile_local;
  local_40 = (_Base_ptr)pVar1.first._M_node;
  local_38 = pVar1.second;
  local_101 = ((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0 &&
              local_20 != (cmMakefile *)0x0;
  if (local_101) {
    local_30 = local_40;
    local_28 = local_38;
    cmMakefile::GetBacktrace(&local_e0,local_20);
    std::make_pair<std::__cxx11::string_const&,cmListFileBacktrace>
              (&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x,
               &local_e0);
    std::
    map<std::__cxx11::string,cmListFileBacktrace,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmListFileBacktrace>>>
    ::insert<std::pair<std::__cxx11::string,cmListFileBacktrace>>
              ((map<std::__cxx11::string,cmListFileBacktrace,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmListFileBacktrace>>>
                *)&this->UtilityBacktraces,&local_a0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
    ::~pair(&local_a0);
    cmListFileBacktrace::~cmListFileBacktrace(&local_e0);
  }
  return;
}

Assistant:

void cmTarget::AddUtility(const std::string& u, cmMakefile *makefile)
{
  if(this->Utilities.insert(u).second && makefile)
    {
    this->UtilityBacktraces.insert(
            std::make_pair(u, makefile->GetBacktrace()));
    }
}